

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba.h
# Opt level: O0

uint ClownLZSS::Internal::Gba::EncodeMatch(ClownLZSS_Match *match)

{
  bool bVar1;
  unsigned_long x;
  unsigned_long x_00;
  size_t offset;
  size_t length;
  ClownLZSS_Match *match_local;
  
  x = match->length - 3;
  x_00 = (match->destination - match->source) - 1;
  bVar1 = IsInRange<unsigned_long,_unsigned_int,_unsigned_int>(x,0,0xf);
  if (!bVar1) {
    __assert_fail("IsInRange(length, 0u, maximum_encoded_length)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Clownacy[P]clownlzss/compressors/gba.h"
                  ,0x79,
                  "unsigned int ClownLZSS::Internal::Gba::EncodeMatch(const ClownLZSS_Match &)");
  }
  bVar1 = IsInRange<unsigned_long,_unsigned_int,_unsigned_int>(x_00,0,0xfff);
  if (!bVar1) {
    __assert_fail("IsInRange(offset, 0u, maximum_encoded_offset)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Clownacy[P]clownlzss/compressors/gba.h"
                  ,0x7a,
                  "unsigned int ClownLZSS::Internal::Gba::EncodeMatch(const ClownLZSS_Match &)");
  }
  return (uint)((x_00 & 0xff) << 8) | (int)x * 0x10 | (uint)(x_00 >> 8);
}

Assistant:

inline unsigned int EncodeMatch(const ClownLZSS_Match& match)
			{
				using namespace Compressor;

				const std::size_t length = match.length - minimum_match_length;
				const std::size_t offset = match.destination - match.source - 1;

				assert(IsInRange(length, 0u, maximum_encoded_length));
				assert(IsInRange(offset, 0u, maximum_encoded_offset));

				return ((offset & 255) << 8) | ((length) << 4) | (offset >> 8);
			}